

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

int Ssw_RarCheckTrivial(Aig_Man_t *pAig,int fVerbose)

{
  void *pvVar1;
  Abc_Cex_t *pAVar2;
  uint i;
  int nRegs;
  
  i = 0;
  while( true ) {
    if (pAig->nTruePos <= (int)i) {
      return 0;
    }
    pvVar1 = Vec_PtrEntry(pAig->vCos,i);
    if ((pAig->nConstrs != 0) && (pAig->nTruePos - pAig->nConstrs <= (int)i)) break;
    if ((*(byte *)((long)pvVar1 + 0x18) & 8) != 0) {
      if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pAig->pSeqModel);
        pAig->pSeqModel = (Abc_Cex_t *)0x0;
      }
      nRegs = pAig->nRegs;
      pAVar2 = Abc_CexAlloc(nRegs,pAig->nTruePis,1);
      pAig->pSeqModel = pAVar2;
      pAVar2->iPo = i;
      if (fVerbose == 0) {
        return 1;
      }
      Abc_Print(nRegs,"Output %d is trivally SAT in frame 0. \n",(ulong)i);
      return 1;
    }
    i = i + 1;
  }
  return 0;
}

Assistant:

int Ssw_RarCheckTrivial( Aig_Man_t * pAig, int fVerbose )
{
    Aig_Obj_t * pObj;
    int i;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( pAig->nConstrs && i >= Saig_ManPoNum(pAig) - pAig->nConstrs )
            return 0;
        if ( pObj->fPhase )
        {
            ABC_FREE( pAig->pSeqModel );
            pAig->pSeqModel = Abc_CexAlloc( Aig_ManRegNum(pAig), Saig_ManPiNum(pAig), 1 );
            pAig->pSeqModel->iPo = i;
            if ( fVerbose )
                Abc_Print( 1, "Output %d is trivally SAT in frame 0. \n", i );
            return 1;
        }
    }
    return 0;
}